

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

int __thiscall QPDF::lengthNextN(QPDF *this,int first_object,int n)

{
  long lVar1;
  int iVar2;
  pointer pMVar3;
  size_type sVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  qpdf_offset_t qVar7;
  string_view msg;
  long local_d8;
  allocator<char> local_c9;
  string local_c8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string_view local_38;
  QPDFObjGen local_28;
  QPDFObjGen og;
  int i;
  int length;
  int n_local;
  int first_object_local;
  QPDF *this_local;
  
  og.gen = 0;
  for (og.obj = 0; og.obj < n; og.obj = og.obj + 1) {
    QPDFObjGen::QPDFObjGen(&local_28,first_object + og.obj,0);
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    sVar4 = std::
            map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
            ::count(&pMVar3->xref_table,&local_28);
    if (sVar4 == 0) {
      std::__cxx11::to_string(&local_98,first_object + og.obj);
      std::operator+(&local_78,"no xref table entry for ",&local_98);
      std::operator+(&local_58,&local_78," 0");
      msg = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
      local_38 = msg;
      linearizationWarning(this,msg);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
    }
    else {
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      sVar5 = std::
              map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
              ::count(&pMVar3->obj_cache,&local_28);
      if (sVar5 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,
                   "found unknown object while calculating length for linearization data",&local_c9)
        ;
        stopOnError(this,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator(&local_c9);
      }
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      pmVar6 = std::
               map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
               ::operator[](&pMVar3->obj_cache,&local_28);
      lVar1 = pmVar6->end_after_space;
      qVar7 = getLinearizationOffset(this,local_28);
      local_d8 = lVar1 - qVar7;
      iVar2 = toI<long_long>(&local_d8);
      og.gen = iVar2 + og.gen;
    }
  }
  return og.gen;
}

Assistant:

int
QPDF::lengthNextN(int first_object, int n)
{
    int length = 0;
    for (int i = 0; i < n; ++i) {
        QPDFObjGen og(first_object + i, 0);
        if (m->xref_table.count(og) == 0) {
            linearizationWarning(
                "no xref table entry for " + std::to_string(first_object + i) + " 0");
        } else {
            if (m->obj_cache.count(og) == 0) {
                stopOnError("found unknown object while calculating length for linearization data");
            }
            length += toI(m->obj_cache[og].end_after_space - getLinearizationOffset(og));
        }
    }
    return length;
}